

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateEqualsCode
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = "if (!get$capitalized_name$()\n    .equals(other.get$capitalized_name$())) return false;\n"
  ;
  if (*(int *)(*(long *)((this->super_ImmutableEnumFieldGenerator).descriptor_ + 0x28) + 0x3c) == 3)
  {
    text = 
    "if (get$capitalized_name$Value()\n    != other.get$capitalized_name$Value()) return false;\n";
  }
  io::Printer::Print(printer,&(this->super_ImmutableEnumFieldGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::GenerateEqualsCode(
    io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(
        variables_,
        "if (get$capitalized_name$Value()\n"
        "    != other.get$capitalized_name$Value()) return false;\n");
  } else {
    printer->Print(
        variables_,
        "if (!get$capitalized_name$()\n"
        "    .equals(other.get$capitalized_name$())) return false;\n");
  }
}